

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::BasicReporter(BasicReporter *this,ReporterConfig *config)

{
  undefined8 *in_RDI;
  ReporterConfig *in_stack_ffffffffffffffb8;
  SpanInfo *in_stack_ffffffffffffffc0;
  SpanInfo *this_00;
  
  SharedImpl<Catch::IReporter>::SharedImpl
            ((SharedImpl<Catch::IReporter> *)in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__BasicReporter_001ef000;
  ReporterConfig::ReporterConfig
            ((ReporterConfig *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined1 *)(in_RDI + 4) = 1;
  SpanInfo::SpanInfo(in_stack_ffffffffffffffc0);
  this_00 = (SpanInfo *)(in_RDI + 10);
  SpanInfo::SpanInfo(this_00);
  SpanInfo::SpanInfo(this_00);
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  vector((vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_> *)
         0x1c9654);
  *(undefined1 *)(in_RDI + 0x17) = 0;
  return;
}

Assistant:

BasicReporter( const ReporterConfig& config )
        :   m_config( config ),
            m_firstSectionInTestCase( true ),
            m_aborted( false )
        {}